

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

ArrayCopy * __thiscall
wasm::Builder::makeArrayCopy
          (Builder *this,Expression *destRef,Expression *destIndex,Expression *srcRef,
          Expression *srcIndex,Expression *length)

{
  ArrayCopy *this_00;
  ArrayCopy *ret;
  Expression *length_local;
  Expression *srcIndex_local;
  Expression *srcRef_local;
  Expression *destIndex_local;
  Expression *destRef_local;
  Builder *this_local;
  
  this_00 = MixedArena::alloc<wasm::ArrayCopy>(&this->wasm->allocator);
  this_00->destRef = destRef;
  this_00->destIndex = destIndex;
  this_00->srcRef = srcRef;
  this_00->srcIndex = srcIndex;
  this_00->length = length;
  ArrayCopy::finalize(this_00);
  return this_00;
}

Assistant:

ArrayCopy* makeArrayCopy(Expression* destRef,
                           Expression* destIndex,
                           Expression* srcRef,
                           Expression* srcIndex,
                           Expression* length) {
    auto* ret = wasm.allocator.alloc<ArrayCopy>();
    ret->destRef = destRef;
    ret->destIndex = destIndex;
    ret->srcRef = srcRef;
    ret->srcIndex = srcIndex;
    ret->length = length;
    ret->finalize();
    return ret;
  }